

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::rearrange(QMdiAreaPrivate *this,Rearranger *rearranger)

{
  QList<QMdi::Rearranger_*> *vector;
  uint uVar1;
  QWidget *this_00;
  Representation RVar2;
  QMdiSubWindow **ppQVar3;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  QSize QVar7;
  Representation RVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  int local_b4;
  QSize local_b0;
  QSize local_a8;
  QRect local_90;
  QSize local_80;
  QArrayDataPointer<QMdiSubWindow_*> local_78;
  QArrayDataPointer<QWidget_*> local_58;
  Rearranger *rearranger_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rearranger_local = rearranger;
  if (rearranger != (Rearranger *)0x0) {
    if ((*(byte *)(*(long *)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                       super_QWidgetPrivate.field_0x8 + 0x20) + 9) & 0x80) == 0) {
      vector = &this->pendingRearrangements;
      qVar6 = QtPrivate::indexOf<QMdi::Rearranger*,QMdi::Rearranger*>(vector,&rearranger_local,0);
      if ((int)qVar6 == -1) {
        QList<QMdi::Rearranger_*>::append(vector,rearranger_local);
      }
      else {
        QList<QMdi::Rearranger_*>::move
                  (vector,(long)(int)qVar6,(this->pendingRearrangements).d.size + -1);
      }
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QWidget **)0x0;
      local_58.size = 0;
      iVar5 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
      subWindowList((QList<QMdiSubWindow_*> *)&local_78,this,this->activationOrder,iVar5 == 0);
      ppQVar3 = local_78.ptr;
      local_80.wd.m_i = -1;
      local_80.ht.m_i = -1;
      local_b0.wd.m_i = -1;
      local_b0.ht.m_i = -1;
      lVar9 = local_78.size << 3;
      local_b4 = -1;
      local_a8.wd.m_i = -1;
      local_a8.ht.m_i = -1;
      for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 8) {
        this_00 = *(QWidget **)((long)ppQVar3 + lVar10);
        bVar4 = sanityCheck((QMdiSubWindow *)this_00,"QMdiArea::rearrange");
        if ((bVar4) && ((this_00->data->widget_attributes & 0x8000) != 0)) {
          iVar5 = (*rearranger->_vptr_Rearranger[1])();
          bVar4 = QWidget::isMinimized(this_00);
          if (iVar5 == 2) {
            if ((bVar4) && (bVar4 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00), !bVar4)) {
LAB_0040c850:
              QList<QWidget_*>::append((QList<QWidget_*> *)&local_58,this_00);
            }
          }
          else if ((!bVar4) || (bVar4 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00), bVar4)) {
            bVar4 = QWidget::isMaximized(this_00);
            if ((bVar4) || (bVar4 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00), bVar4)) {
              QWidget::showNormal(this_00);
            }
            QVar7 = QWidget::minimumSize(this_00);
            if (local_a8.wd.m_i.m_i <= QVar7.wd.m_i.m_i) {
              local_a8 = QVar7;
            }
            RVar8.m_i = QVar7.ht.m_i.m_i;
            if (QVar7.ht.m_i.m_i < local_b4) {
              RVar8.m_i = local_b4;
            }
            uVar1 = *(uint *)(*(long *)&this_00->field_0x8 + 0x2b8);
            RVar2.m_i = local_a8.wd.m_i.m_i;
            if (local_a8.wd.m_i.m_i <= (int)uVar1) {
              RVar2.m_i = uVar1;
            }
            local_a8.ht.m_i = 0;
            local_a8.wd.m_i = RVar2.m_i;
            iVar5 = *(int *)(*(long *)&this_00->field_0x8 + 700);
            local_b4 = RVar8.m_i;
            if (RVar8.m_i <= iVar5) {
              local_b4 = iVar5;
            }
            local_b0.ht.m_i = local_b4;
            local_b0.wd.m_i = RVar2.m_i;
            goto LAB_0040c850;
          }
        }
      }
      local_80 = local_b0;
      local_90 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
      iVar5 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar5 == 0) && (local_58.size != 0)) {
        local_90 = resizeToMinimumTileSize(this,&local_80,(int)local_58.size);
      }
      (**rearranger->_vptr_Rearranger)(rearranger,&local_58,&local_90);
      iVar5 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar5 == 0) && (local_58.size != 0)) {
        this->isSubWindowsTiled = true;
        updateScrollBars(this);
      }
      else {
        iVar5 = (*rearranger->_vptr_Rearranger[1])(rearranger);
        if (iVar5 == 1) {
          this->isSubWindowsTiled = false;
        }
      }
      QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::rearrange(Rearranger *rearranger)
{
    if (!rearranger)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // Compress if we already have the rearranger in the list.
        int index = pendingRearrangements.indexOf(rearranger);
        if (index != -1)
            pendingRearrangements.move(index, pendingRearrangements.size() - 1);
        else
            pendingRearrangements.append(rearranger);
        return;
    }

    QList<QWidget *> widgets;
    const bool reverseList = rearranger->type() == Rearranger::RegularTiler;
    const QList<QMdiSubWindow *> subWindows = subWindowList(activationOrder, reverseList);
    QSize minSubWindowSize;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::rearrange") || !child->isVisible())
            continue;
        if (rearranger->type() == Rearranger::IconTiler) {
            if (child->isMinimized() && !child->isShaded())
                widgets.append(child);
        } else {
            if (child->isMinimized() && !child->isShaded())
                continue;
            if (child->isMaximized() || child->isShaded())
                child->showNormal();
            minSubWindowSize = minSubWindowSize.expandedTo(child->minimumSize())
                               .expandedTo(child->d_func()->internalMinimumSize);
            widgets.append(child);
        }
    }

    QRect domain = viewport->rect();
    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty())
        domain = resizeToMinimumTileSize(minSubWindowSize, widgets.size());

    rearranger->rearrange(widgets, domain);

    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty()) {
        isSubWindowsTiled = true;
        updateScrollBars();
    } else if (rearranger->type() == Rearranger::SimpleCascader) {
        isSubWindowsTiled = false;
    }
}